

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O1

vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *
ellipses::cleanup_center_points
          (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *__return_storage_ptr__,
          vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *points,Mat *img,bool debug)

{
  pointer pPVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  int iVar5;
  undefined7 in_register_00000009;
  pointer pPVar6;
  iterator __first;
  long lVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  initializer_list<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_> __l;
  allocator_type local_189;
  Point2f local_188;
  float fStack_180;
  float fStack_17c;
  float fStack_178;
  int iStack_174;
  undefined8 uStack_170;
  double local_168;
  undefined8 uStack_160;
  double local_158;
  undefined8 uStack_150;
  ulong local_140;
  _InputArray local_138;
  undefined4 local_11c;
  RotatedRect ellipse;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_e0;
  undefined8 local_c8;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_c0;
  undefined4 local_a8 [2];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_a0;
  undefined8 local_98;
  Mat tmp;
  
  local_11c = (undefined4)CONCAT71(in_register_00000009,debug);
  ellipse.center.x = 0.0;
  ellipse.center.y = 0.0;
  ellipse.size.width = 0.0;
  ellipse.size.height = 0.0;
  ellipse.angle = 0.0;
  local_140 = 0;
  do {
    if ((ulong)((long)(points->
                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) < 0x29) break;
    _tmp = 0x8103000c;
    cv::fitEllipse((_InputArray *)&local_188);
    ellipse.size.width = fStack_180;
    ellipse.size.height = fStack_17c;
    ellipse.angle = fStack_178;
    ellipse.center = local_188;
    if ((char)local_11c != '\0') {
      cv::Mat::clone();
      local_138.sz.width = 0;
      local_138.sz.height = 0;
      local_138.flags = 0x3010000;
      local_138.obj = &tmp;
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(&local_e0,points);
      __l._M_len = 1;
      __l._M_array = &local_e0;
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::vector(&local_c0,__l,&local_189);
      local_98 = 0;
      local_a8[0] = 0x8104000c;
      local_188.x = 0.0;
      local_188.y = 3.7480469;
      uStack_170 = 0;
      fStack_180 = 0.0;
      fStack_17c = 0.0;
      fStack_178 = 0.0;
      iStack_174 = 0;
      local_a0 = &local_c0;
      uVar3 = cv::noArray();
      local_c8 = 0;
      cv::drawContours(&local_138,local_a8,0,(_InputArray *)&local_188,3,8,uVar3,0x7fffffff,
                       &local_c8);
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::~vector(&local_c0);
      if (local_e0.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_e0.
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e0.
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_138.sz.width = 0;
      local_138.sz.height = 0;
      local_138.flags = 0x3010000;
      local_188.x = 0.0;
      local_188.y = 0.0;
      fStack_180 = 0.0;
      fStack_17c = 3.7480469;
      fStack_178 = 0.0;
      iStack_174 = 0;
      uStack_170 = 0;
      local_138.obj = &tmp;
      cv::ellipse((_InputOutputArray *)&local_138,&ellipse,(Scalar_ *)&local_188,3,8);
      local_188 = (Point2f)&fStack_178;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Cleanup","");
      cv::namedWindow((string *)&local_188,0);
      if (local_188 != (Point2f)&fStack_178) {
        operator_delete((void *)local_188,CONCAT44(iStack_174,fStack_178) + 1);
      }
      local_188 = (Point2f)&fStack_178;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Cleanup","");
      local_138.sz.width = 0;
      local_138.sz.height = 0;
      local_138.flags = 0x1010000;
      local_138.obj = &tmp;
      cv::imshow((string *)&local_188,&local_138);
      if (local_188 != (Point2f)&fStack_178) {
        operator_delete((void *)local_188,CONCAT44(iStack_174,fStack_178) + 1);
      }
      cv::waitKey(0);
      cv::destroyAllWindows();
      cv::Mat::~Mat(&tmp);
    }
    uVar4 = 8;
    if (local_140 < 8) {
      uVar4 = local_140;
    }
    dVar11 = ((double)(long)uVar4 * 0.03 + 0.24) * (double)ellipse.size.width;
    iVar9 = (int)ROUND(ellipse.center.x);
    iVar8 = (int)ROUND(ellipse.center.y);
    local_158 = ((double)(long)uVar4 * -0.03 + 0.82) * (double)ellipse.size.width;
    uStack_150 = 0;
    pPVar6 = (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pPVar1 = (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    lVar7 = (long)pPVar1 - (long)pPVar6 >> 5;
    uStack_160 = 0;
    local_168 = dVar11;
    if (0 < lVar7) {
      lVar7 = lVar7 + 1;
      pPVar6 = pPVar6 + 2;
      do {
        __first._M_current = pPVar6;
        iVar2 = __first._M_current[-2].x - iVar9;
        iVar5 = __first._M_current[-2].y - iVar8;
        dVar10 = (double)(iVar5 * iVar5 + iVar2 * iVar2);
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
          dVar11 = local_168;
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        if ((dVar10 < dVar11) || (local_158 < dVar10)) {
          __first._M_current = __first._M_current + -2;
          goto LAB_001129c8;
        }
        iVar2 = __first._M_current[-1].x - iVar9;
        iVar5 = __first._M_current[-1].y - iVar8;
        dVar10 = (double)(iVar5 * iVar5 + iVar2 * iVar2);
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
          dVar11 = local_168;
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        if ((dVar10 < dVar11) || (local_158 < dVar10)) {
          __first._M_current = __first._M_current + -1;
          goto LAB_001129c8;
        }
        iVar2 = (__first._M_current)->x - iVar9;
        iVar5 = (__first._M_current)->y - iVar8;
        dVar10 = (double)(iVar5 * iVar5 + iVar2 * iVar2);
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
          dVar11 = local_168;
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        if ((dVar10 < dVar11) || (local_158 < dVar10)) goto LAB_001129c8;
        iVar2 = __first._M_current[1].x - iVar9;
        iVar5 = __first._M_current[1].y - iVar8;
        dVar10 = (double)(iVar5 * iVar5 + iVar2 * iVar2);
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
          dVar11 = local_168;
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        if ((dVar10 < dVar11) || (local_158 < dVar10)) {
          __first._M_current = __first._M_current + 1;
          goto LAB_001129c8;
        }
        lVar7 = lVar7 + -1;
        pPVar6 = __first._M_current + 4;
      } while (1 < lVar7);
      pPVar6 = __first._M_current + 2;
    }
    lVar7 = (long)pPVar1 - (long)pPVar6 >> 3;
    if (lVar7 == 1) {
LAB_00112971:
      iVar2 = pPVar6->x - iVar9;
      iVar5 = pPVar6->y - iVar8;
      dVar10 = (double)(iVar5 * iVar5 + iVar2 * iVar2);
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
        dVar11 = local_168;
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      __first._M_current = pPVar6;
      if (dVar11 <= dVar10 && dVar10 <= local_158) {
        __first._M_current = pPVar1;
      }
    }
    else if (lVar7 == 2) {
LAB_00112929:
      iVar2 = pPVar6->x - iVar9;
      iVar5 = pPVar6->y - iVar8;
      dVar10 = (double)(iVar5 * iVar5 + iVar2 * iVar2);
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
        dVar11 = local_168;
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      __first._M_current = pPVar6;
      if ((dVar11 <= dVar10) && (dVar10 <= local_158)) {
        pPVar6 = pPVar6 + 1;
        goto LAB_00112971;
      }
    }
    else {
      __first._M_current = pPVar1;
      if (lVar7 == 3) {
        iVar2 = pPVar6->x - iVar9;
        iVar5 = pPVar6->y - iVar8;
        dVar10 = (double)(iVar5 * iVar5 + iVar2 * iVar2);
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
          dVar11 = local_168;
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        __first._M_current = pPVar6;
        if ((dVar11 <= dVar10) && (dVar10 <= local_158)) {
          pPVar6 = pPVar6 + 1;
          goto LAB_00112929;
        }
      }
    }
LAB_001129c8:
    pPVar6 = __first._M_current + 1;
    if (pPVar6 != pPVar1 && __first._M_current != pPVar1) {
      do {
        iVar2 = pPVar6->x - iVar9;
        iVar5 = pPVar6->y - iVar8;
        dVar10 = (double)(iVar5 * iVar5 + iVar2 * iVar2);
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
          dVar11 = local_168;
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        if ((dVar11 <= dVar10) && (dVar10 <= local_158)) {
          (__first._M_current)->x = pPVar6->x;
          (__first._M_current)->y = pPVar6->y;
          __first._M_current = __first._M_current + 1;
        }
        pPVar6 = pPVar6 + 1;
      } while (pPVar6 != pPVar1);
    }
    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::_M_erase
              (points,__first,
               (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    local_140 = local_140 + 1;
  } while (local_140 != 0xc);
  (__return_storage_ptr__->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
  _M_impl.super__Vector_impl_data._M_start =
       (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
  _M_impl.super__Vector_impl_data._M_finish =
       (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::vector<cv::Point> cleanup_center_points(std::vector<cv::Point> points, const cv::Mat& img, bool debug)
{
    std::ptrdiff_t erase_count = 0;
    cv::RotatedRect ellipse;
    std::size_t iteration = 0;
    const constexpr std::size_t max_iteration = 8;
    const constexpr double step = 0.03;
    const constexpr double lower_start = 0.48 - (step * double(max_iteration));
    const constexpr double upper_start = 0.58 + (step * double(max_iteration));
    while(iteration < 12 && points.size() > 5)
    {
        ellipse = cv::fitEllipse(points);

        if(debug)
        {
            auto tmp = img.clone();
            cv::drawContours(tmp, std::vector<std::vector<cv::Point>> {points}, 0, cv::Scalar(255, 0, 0), 3);
            cv::ellipse(tmp, ellipse, cv::Scalar(0, 255, 0), 3);
            cv::namedWindow("Cleanup", cv::WINDOW_NORMAL);
            cv::imshow("Cleanup", tmp);
            cv::waitKey(0);
            cv::destroyAllWindows();
        }

        auto lower_threshold = ellipse.size.width * (lower_start + step * std::min(iteration, max_iteration));
        auto upper_threshold = ellipse.size.width * (upper_start - step * std::min(iteration, max_iteration));

        cv::Point center = ellipse.center;

        auto it = std::remove_if(
            points.begin(), points.end(), [center, lower_threshold, upper_threshold](const cv::Point& p) {
                auto dis = euclideanDistance(p, center);
                return dis < lower_threshold || dis > upper_threshold;
            });
        erase_count = std::distance(it, points.end());
        points.erase(it, points.end());
        iteration++;
    }
    return points;
}